

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O2

ELzmaDummy LzmaDec_TryDummy(CLzmaDec *p,Byte *buf,SizeT inSize)

{
  byte *pbVar1;
  bool bVar2;
  uint uVar3;
  ELzmaDummy EVar4;
  byte bVar5;
  uint uVar6;
  ELzmaDummy EVar7;
  SizeT SVar8;
  uint uVar9;
  ELzmaDummy EVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  UInt16 *pUVar15;
  uint i;
  UInt32 UVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  
  uVar12 = p->range;
  UVar16 = p->code;
  pbVar1 = buf + inSize;
  pUVar15 = p->probs;
  uVar17 = p->state;
  uVar14 = p->processedPos;
  uVar9 = ~(-1 << ((byte)(p->prop).pb & 0x1f)) & uVar14;
  if (uVar12 < 0x1000000) {
    if (0 < (long)inSize) {
      uVar12 = uVar12 << 8;
      bVar5 = *buf;
      inSize = (SizeT)bVar5;
      buf = buf + 1;
      UVar16 = UVar16 << 8 | (uint)bVar5;
      goto LAB_0011136c;
    }
LAB_0011194f:
    EVar7 = (ELzmaDummy)inSize;
    bVar2 = false;
    EVar10 = DUMMY_ERROR;
  }
  else {
LAB_0011136c:
    uVar13 = (uVar12 >> 0xb) * (uint)pUVar15[(ulong)(uVar17 << 4) + (ulong)uVar9];
    uVar6 = UVar16 - uVar13;
    if (UVar16 < uVar13) {
      pUVar15 = pUVar15 + 0x736;
      if (p->checkDicSize != 0 || uVar14 != 0) {
        bVar5 = (byte)(p->prop).lc;
        SVar8 = p->dicPos;
        if (SVar8 == 0) {
          SVar8 = p->dicBufSize;
        }
        pUVar15 = pUVar15 + ((uint)(p->dic[SVar8 - 1] >> (8 - bVar5 & 0x1f)) +
                            ((uVar14 & ~(-1 << ((byte)(p->prop).lp & 0x1f))) << (bVar5 & 0x1f))) *
                            0x300;
      }
      uVar12 = uVar13;
      if (uVar17 < 7) {
        inSize = 1;
        uVar17 = 1;
        do {
          if (uVar12 < 0x1000000) {
            if (pbVar1 <= buf) goto LAB_0011194f;
            uVar12 = uVar12 << 8;
            bVar5 = *buf;
            buf = buf + 1;
            UVar16 = UVar16 << 8 | (uint)bVar5;
          }
          uVar14 = (uVar12 >> 0xb) * (uint)pUVar15[uVar17];
          if (UVar16 < uVar14) {
            uVar17 = uVar17 * 2;
            uVar12 = uVar14;
          }
          else {
            uVar12 = uVar12 - uVar14;
            uVar17 = uVar17 * 2 + 1;
            UVar16 = UVar16 - uVar14;
          }
        } while (uVar17 < 0x100);
      }
      else {
        if (p->dicPos < (ulong)p->reps[0]) {
          SVar8 = p->dicBufSize;
        }
        else {
          SVar8 = 0;
        }
        uVar14 = (uint)p->dic[SVar8 + (p->dicPos - (ulong)p->reps[0])];
        inSize = 1;
        uVar11 = 0x100;
        uVar17 = 1;
        do {
          uVar14 = uVar14 * 2;
          uVar6 = uVar14 & (uint)uVar11;
          uVar9 = uVar12;
          if (uVar12 < 0x1000000) {
            if (pbVar1 <= buf) goto LAB_0011194f;
            uVar9 = uVar12 << 8;
            bVar5 = *buf;
            buf = buf + 1;
            UVar16 = UVar16 << 8 | (uint)bVar5;
          }
          uVar12 = (uVar9 >> 0xb) * (uint)pUVar15[uVar11 + (ulong)uVar6 + (ulong)uVar17];
          uVar13 = UVar16 - uVar12;
          if (UVar16 < uVar12) {
            uVar17 = uVar17 * 2;
            uVar11 = (ulong)(uVar6 ^ (uint)uVar11);
          }
          else {
            uVar12 = uVar9 - uVar12;
            uVar17 = uVar17 * 2 + 1;
            uVar11 = (ulong)uVar6;
            UVar16 = uVar13;
          }
        } while (uVar17 < 0x100);
      }
      EVar7 = DUMMY_LIT;
      bVar2 = true;
      EVar10 = DUMMY_ERROR;
      goto LAB_00111951;
    }
    uVar12 = uVar12 - uVar13;
    if (uVar12 < 0x1000000) {
      if (pbVar1 <= buf) goto LAB_0011194f;
      uVar12 = uVar12 * 0x100;
      bVar5 = *buf;
      buf = buf + 1;
      uVar6 = uVar6 * 0x100 | (uint)bVar5;
    }
    uVar13 = (uVar12 >> 0xb) * (uint)pUVar15[(ulong)uVar17 + 0xc0];
    uVar14 = uVar6 - uVar13;
    if (uVar6 < uVar13) {
      inSize = 2;
      lVar19 = 0x664;
      uVar14 = uVar6;
      uVar18 = uVar13;
    }
    else {
      uVar12 = uVar12 - uVar13;
      uVar18 = uVar12;
      if (uVar12 < 0x1000000) {
        if (pbVar1 <= buf) {
          inSize = 3;
          goto LAB_0011194f;
        }
        uVar18 = uVar12 * 0x100;
        bVar5 = *buf;
        buf = buf + 1;
        uVar14 = uVar14 * 0x100 | (uint)bVar5;
      }
      inSize = 3;
      EVar7 = DUMMY_REP;
      uVar12 = (uVar18 >> 0xb) * (uint)pUVar15[(ulong)uVar17 + 0xcc];
      uVar3 = uVar14 - uVar12;
      if (uVar14 < uVar12) {
        uVar18 = uVar12;
        if (uVar12 < 0x1000000) {
          if (pbVar1 <= buf) goto LAB_0011194f;
          uVar18 = uVar12 * 0x100;
          bVar5 = *buf;
          buf = buf + 1;
          uVar14 = uVar14 << 8 | (uint)bVar5;
        }
        uVar12 = (uVar18 >> 0xb) * (uint)pUVar15[(ulong)(uVar17 << 4) + (ulong)uVar9 + 0xf0];
        if (uVar14 < uVar12) {
          if (uVar12 < 0x1000000) {
            if (pbVar1 <= buf) {
              bVar2 = false;
              EVar10 = DUMMY_ERROR;
              goto LAB_00111951;
            }
            uVar12 = uVar12 * 0x100;
            buf = buf + 1;
          }
          bVar2 = false;
          EVar10 = DUMMY_REP;
          goto LAB_00111951;
        }
        lVar19 = 0xa68;
        uVar14 = uVar14 - uVar12;
        uVar18 = uVar18 - uVar12;
      }
      else {
        uVar12 = uVar18 - uVar12;
        if (uVar12 < 0x1000000) {
          if (pbVar1 <= buf) goto LAB_0011194f;
          uVar12 = uVar12 * 0x100;
          bVar5 = *buf;
          buf = buf + 1;
          uVar3 = uVar3 * 0x100 | (uint)bVar5;
        }
        uVar18 = (uVar12 >> 0xb) * (uint)pUVar15[(ulong)uVar17 + 0xd8];
        lVar19 = 0xa68;
        uVar14 = uVar3;
        if (uVar18 <= uVar3) {
          uVar12 = uVar12 - uVar18;
          uVar14 = uVar3 - uVar18;
          if (uVar12 < 0x1000000) {
            if (pbVar1 <= buf) goto LAB_0011194f;
            uVar12 = uVar12 * 0x100;
            bVar5 = *buf;
            buf = buf + 1;
            uVar14 = (uVar3 - uVar18) * 0x100 | (uint)bVar5;
          }
          uVar18 = (uVar12 >> 0xb) * (uint)pUVar15[(ulong)uVar17 + 0xe4];
          if (uVar18 <= uVar14) {
            uVar14 = uVar14 - uVar18;
            uVar18 = uVar12 - uVar18;
          }
        }
      }
    }
    uVar12 = uVar18;
    EVar7 = (ELzmaDummy)inSize;
    uVar17 = uVar12;
    if (uVar12 < 0x1000000) {
      if (pbVar1 <= buf) goto LAB_0011194f;
      uVar17 = uVar12 << 8;
      bVar5 = *buf;
      buf = buf + 1;
      uVar14 = uVar14 << 8 | (uint)bVar5;
    }
    uVar12 = (uVar17 >> 0xb) * (uint)*(ushort *)((long)pUVar15 + lVar19);
    uVar3 = 8;
    uVar18 = uVar14 - uVar12;
    if (uVar14 < uVar12) {
      lVar19 = (long)pUVar15 + (ulong)(uVar9 << 3) * 2 + lVar19 + 4;
      iVar20 = 0;
    }
    else {
      uVar12 = uVar17 - uVar12;
      uVar17 = uVar12;
      if (uVar12 < 0x1000000) {
        if (pbVar1 <= buf) goto LAB_0011194f;
        bVar5 = *buf;
        buf = buf + 1;
        uVar18 = (uint)bVar5 | uVar18 * 0x100;
        uVar17 = uVar12 * 0x100;
      }
      uVar12 = (uVar17 >> 0xb) * (uint)*(ushort *)((long)pUVar15 + lVar19 + 2);
      uVar14 = uVar18 - uVar12;
      if (uVar18 < uVar12) {
        lVar19 = (long)pUVar15 + (ulong)(uVar9 << 3) * 2 + lVar19 + 0x104;
        iVar20 = 8;
        uVar14 = uVar18;
      }
      else {
        uVar12 = uVar17 - uVar12;
        lVar19 = (long)pUVar15 + lVar19 + 0x204;
        iVar20 = 0x10;
        uVar3 = 0x100;
      }
    }
    uVar11 = 1;
    do {
      uVar17 = uVar12;
      if (uVar12 < 0x1000000) {
        if (pbVar1 <= buf) goto LAB_0011194f;
        uVar17 = uVar12 << 8;
        bVar5 = *buf;
        buf = buf + 1;
        uVar14 = uVar14 << 8 | (uint)bVar5;
      }
      uVar12 = (uVar17 >> 0xb) * (uint)*(ushort *)(lVar19 + uVar11 * 2);
      uVar9 = uVar14 - uVar12;
      if (uVar14 < uVar12) {
        uVar17 = (int)uVar11 * 2;
        uVar9 = uVar14;
      }
      else {
        uVar12 = uVar17 - uVar12;
        uVar17 = (int)uVar11 * 2 + 1;
      }
      uVar11 = (ulong)uVar17;
      uVar14 = uVar9;
    } while (uVar17 < uVar3);
    bVar2 = true;
    EVar10 = DUMMY_ERROR;
    if (uVar6 < uVar13) {
      uVar17 = (iVar20 - uVar3) + uVar17;
      uVar14 = 3;
      if (uVar17 < 3) {
        uVar14 = uVar17;
      }
      uVar17 = 1;
      do {
        uVar6 = uVar12;
        if (uVar12 < 0x1000000) {
          if (pbVar1 <= buf) goto LAB_0011194f;
          uVar6 = uVar12 << 8;
          bVar5 = *buf;
          buf = buf + 1;
          uVar9 = uVar9 << 8 | (uint)bVar5;
        }
        uVar12 = (uVar6 >> 0xb) *
                 (uint)*(ushort *)((long)pUVar15 + (ulong)uVar17 * 2 + (ulong)(uVar14 << 7) + 0x360)
        ;
        uVar13 = uVar9 - uVar12;
        if (uVar9 < uVar12) {
          uVar17 = uVar17 * 2;
          uVar13 = uVar9;
        }
        else {
          uVar12 = uVar6 - uVar12;
          uVar17 = uVar17 * 2 + 1;
        }
        uVar9 = uVar13;
      } while (uVar17 < 0x40);
      uVar14 = uVar17 - 0x40;
      EVar10 = DUMMY_ERROR;
      if (3 < uVar14) {
        if (uVar14 < 0xe) {
          iVar20 = (uVar14 >> 1) - 1;
          pUVar15 = pUVar15 + (ulong)((uVar17 & 1 | 2) << ((byte)iVar20 & 0x1f)) +
                              (0x2af - (ulong)uVar14);
        }
        else {
          iVar20 = (uVar14 >> 1) - 5;
          do {
            if (uVar12 < 0x1000000) {
              if (pbVar1 <= buf) goto LAB_0011194f;
              uVar12 = uVar12 << 8;
              bVar5 = *buf;
              buf = buf + 1;
              uVar13 = uVar13 << 8 | (uint)bVar5;
            }
            uVar12 = uVar12 >> 1;
            uVar17 = 0;
            if (-1 < (int)(uVar13 - uVar12)) {
              uVar17 = uVar12;
            }
            uVar13 = uVar13 - uVar17;
            iVar20 = iVar20 + -1;
          } while (iVar20 != 0);
          pUVar15 = pUVar15 + 0x322;
          iVar20 = 4;
        }
        uVar17 = 1;
        do {
          uVar14 = uVar12;
          if (uVar12 < 0x1000000) {
            if (pbVar1 <= buf) goto LAB_0011194f;
            uVar14 = uVar12 << 8;
            bVar5 = *buf;
            buf = buf + 1;
            uVar13 = uVar13 << 8 | (uint)bVar5;
          }
          uVar12 = (uVar14 >> 0xb) * (uint)pUVar15[uVar17];
          uVar9 = uVar13 - uVar12;
          if (uVar13 < uVar12) {
            uVar17 = uVar17 * 2;
            uVar9 = uVar13;
          }
          else {
            uVar12 = uVar14 - uVar12;
            uVar17 = uVar17 * 2 + 1;
          }
          iVar20 = iVar20 + -1;
          uVar13 = uVar9;
        } while (iVar20 != 0);
      }
    }
  }
LAB_00111951:
  EVar4 = DUMMY_ERROR;
  if (buf < pbVar1) {
    EVar4 = EVar7;
  }
  if (0xffffff < uVar12) {
    EVar4 = EVar7;
  }
  if (!bVar2) {
    EVar4 = EVar10;
  }
  return EVar4;
}

Assistant:

static ELzmaDummy LzmaDec_TryDummy(const CLzmaDec *p, const Byte *buf, SizeT inSize)
{
  UInt32 range = p->range;
  UInt32 code = p->code;
  const Byte *bufLimit = buf + inSize;
  const CLzmaProb *probs = p->probs;
  unsigned state = p->state;
  ELzmaDummy res;

  {
    const CLzmaProb *prob;
    UInt32 bound;
    unsigned ttt;
    unsigned posState = (p->processedPos) & ((1 << p->prop.pb) - 1);

    prob = probs + IsMatch + (state << kNumPosBitsMax) + posState;
    IF_BIT_0_CHECK(prob)
    {
      UPDATE_0_CHECK

      /* if (bufLimit - buf >= 7) return DUMMY_LIT; */

      prob = probs + Literal;
      if (p->checkDicSize != 0 || p->processedPos != 0)
        prob += ((UInt32)LZMA_LIT_SIZE *
            ((((p->processedPos) & ((1 << (p->prop.lp)) - 1)) << p->prop.lc) +
            (p->dic[(p->dicPos == 0 ? p->dicBufSize : p->dicPos) - 1] >> (8 - p->prop.lc))));

      if (state < kNumLitStates)
      {
        unsigned symbol = 1;
        do { GET_BIT_CHECK(prob + symbol, symbol) } while (symbol < 0x100);
      }
      else
      {
        unsigned matchByte = p->dic[p->dicPos - p->reps[0] +
            (p->dicPos < p->reps[0] ? p->dicBufSize : 0)];
        unsigned offs = 0x100;
        unsigned symbol = 1;
        do
        {
          unsigned bit;
          const CLzmaProb *probLit;
          matchByte <<= 1;
          bit = (matchByte & offs);
          probLit = prob + offs + bit + symbol;
          GET_BIT2_CHECK(probLit, symbol, offs &= ~bit, offs &= bit)
        }
        while (symbol < 0x100);
      }
      res = DUMMY_LIT;
    }
    else
    {
      unsigned len;
      UPDATE_1_CHECK;

      prob = probs + IsRep + state;
      IF_BIT_0_CHECK(prob)
      {
        UPDATE_0_CHECK;
        state = 0;
        prob = probs + LenCoder;
        res = DUMMY_MATCH;
      }
      else
      {
        UPDATE_1_CHECK;
        res = DUMMY_REP;
        prob = probs + IsRepG0 + state;
        IF_BIT_0_CHECK(prob)
        {
          UPDATE_0_CHECK;
          prob = probs + IsRep0Long + (state << kNumPosBitsMax) + posState;
          IF_BIT_0_CHECK(prob)
          {
            UPDATE_0_CHECK;
            NORMALIZE_CHECK;
            return DUMMY_REP;
          }
          else
          {
            UPDATE_1_CHECK;
          }
        }
        else
        {
          UPDATE_1_CHECK;
          prob = probs + IsRepG1 + state;
          IF_BIT_0_CHECK(prob)
          {
            UPDATE_0_CHECK;
          }
          else
          {
            UPDATE_1_CHECK;
            prob = probs + IsRepG2 + state;
            IF_BIT_0_CHECK(prob)
            {
              UPDATE_0_CHECK;
            }
            else
            {
              UPDATE_1_CHECK;
            }
          }
        }
        state = kNumStates;
        prob = probs + RepLenCoder;
      }
      {
        unsigned limit, offset;
        const CLzmaProb *probLen = prob + LenChoice;
        IF_BIT_0_CHECK(probLen)
        {
          UPDATE_0_CHECK;
          probLen = prob + LenLow + (posState << kLenNumLowBits);
          offset = 0;
          limit = 1 << kLenNumLowBits;
        }
        else
        {
          UPDATE_1_CHECK;
          probLen = prob + LenChoice2;
          IF_BIT_0_CHECK(probLen)
          {
            UPDATE_0_CHECK;
            probLen = prob + LenMid + (posState << kLenNumMidBits);
            offset = kLenNumLowSymbols;
            limit = 1 << kLenNumMidBits;
          }
          else
          {
            UPDATE_1_CHECK;
            probLen = prob + LenHigh;
            offset = kLenNumLowSymbols + kLenNumMidSymbols;
            limit = 1 << kLenNumHighBits;
          }
        }